

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String * __thiscall Bstrlib::String::operator=(String *this,String *b)

{
  int iVar1;
  uchar *__dest;
  
  if (b != this) {
    if ((this->super_tagbstring).mlen < 1) {
      operator=(this);
    }
    iVar1 = (b->super_tagbstring).slen;
    if ((this->super_tagbstring).mlen <= iVar1) {
      Alloc(this,iVar1);
    }
    iVar1 = (b->super_tagbstring).slen;
    (this->super_tagbstring).slen = iVar1;
    __dest = (this->super_tagbstring).data;
    if (__dest == (uchar *)0x0) {
      (this->super_tagbstring).mlen = 0;
      (this->super_tagbstring).slen = 0;
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x127,"Failure in =(String) operator");
    }
    else {
      memcpy(__dest,(b->super_tagbstring).data,(long)iVar1);
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    }
  }
  return this;
}

Assistant:

const String& String::operator=(const String& b)
    {
        if (&b == this)     return *this;
        if (mlen <= 0)        bstringThrow("Write protection error");
        if (b.slen >= mlen)    Alloc(b.slen);

        slen = b.slen;
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(String) operator");
        }
        else
        {
            memcpy(data, b.data, slen);
            data[slen] = '\0';
        }
        return *this;
    }